

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
     *this,int i)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  
  pFVar1 = (this->left_->fadexpr_).right_;
  pdVar6 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar6 = (pFVar1->dx_).ptr_to_data + i;
  }
  dVar8 = (double)(this->left_->fadexpr_).left_.constant_;
  pFVar2 = (this->right_->fadexpr_).left_;
  pFVar3 = (pFVar2->fadexpr_).right_;
  pFVar4 = (this->right_->fadexpr_).right_;
  dVar9 = (double)(pFVar2->fadexpr_).left_.constant_ + pFVar3->val_ + pFVar4->val_;
  pdVar7 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar7 = (pFVar3->dx_).ptr_to_data + i;
  }
  pdVar5 = &pFVar4->defaultVal;
  if ((pFVar4->dx_).num_elts != 0) {
    pdVar5 = (pFVar4->dx_).ptr_to_data + i;
  }
  return (*pdVar6 * dVar8 * dVar9 - dVar8 * pFVar1->val_ * (*pdVar7 + *pdVar5)) / (dVar9 * dVar9);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}